

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

void pair_lookup_fill_distance(pair_lookup_t pairs,distance_t *distances)

{
  uint i_1;
  uint i_0;
  output_pair_t concat_out;
  uint i;
  distance_t *distances_local;
  
  for (i = 1; i < pairs.outputs_len; i = i + 1) {
    pairs.distances[i] =
         CONCAT22(distances[pairs.outputs[i] >> ((byte)pairs.output_width & 0x1f)],
                  distances[pairs.outputs[i] & pairs.output_mask]);
  }
  return;
}

Assistant:

void pair_lookup_fill_distance(pair_lookup_t pairs, distance_t *distances) {
    for (unsigned int i = 1; i < pairs.outputs_len; i += 1) {
        output_pair_t concat_out = pairs.outputs[i];
        unsigned int i_0 = concat_out & pairs.output_mask;
        concat_out >>= pairs.output_width;
        unsigned int i_1 = concat_out;

        pairs.distances[i] = (distances[i_1] << 16) | distances[i_0];
    }
}